

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

bool __thiscall
GF2::MI<136UL,_GF2::MOGrevlex<136UL>_>::IsGB(MI<136UL,_GF2::MOGrevlex<136UL>_> *this)

{
  undefined1 uVar1;
  bool bVar2;
  WW<136UL> *this_00;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *in_RDI;
  const_reverse_iterator iter1;
  size_t i;
  const_reverse_iterator iter;
  size_t trace;
  MP<136UL,_GF2::MOGrevlex<136UL>_> poly;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *in_stack_fffffffffffffef0;
  reference in_stack_fffffffffffffef8;
  reference in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *in_stack_ffffffffffffff10;
  pointer in_stack_ffffffffffffff18;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *in_stack_ffffffffffffff20;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *poly2;
  undefined7 in_stack_ffffffffffffff78;
  reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_> local_70;
  undefined4 local_64;
  ulong local_60;
  MP<136UL,_GF2::MOGrevlex<136UL>_> local_48;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *in_stack_ffffffffffffffd8;
  MI<136UL,_GF2::MOGrevlex<136UL>_> *in_stack_ffffffffffffffe0;
  bool local_1;
  
  MP<136UL,_GF2::MOGrevlex<136UL>_>::MP
            (in_stack_fffffffffffffef0,
             (MOGrevlex<136UL> *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  local_48.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
  ::rbegin((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
            *)in_stack_fffffffffffffef8);
  do {
    poly2 = &local_48;
    std::__cxx11::
    list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
    ::rend((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
            *)in_stack_fffffffffffffef8);
    uVar1 = std::operator!=((reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                             *)in_stack_fffffffffffffef0,
                            (reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    if (!(bool)uVar1) {
      local_1 = true;
LAB_001835dd:
      local_64 = 1;
      MP<136UL,_GF2::MOGrevlex<136UL>_>::~MP((MP<136UL,_GF2::MOGrevlex<136UL>_> *)0x1835ea);
      return local_1;
    }
    for (local_60 = 0; local_60 < 0x88; local_60 = local_60 + 1) {
      std::reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>::
      operator->((reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                  *)in_stack_fffffffffffffef0);
      this_00 = &MP<136UL,_GF2::MOGrevlex<136UL>_>::LM(in_stack_fffffffffffffef0)->super_WW<136UL>;
      bVar2 = WW<136UL>::Test(this_00,local_60);
      if (bVar2) {
        std::reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>::
        operator*((reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                   *)in_stack_fffffffffffffef0);
        MP<136UL,_GF2::MOGrevlex<136UL>_>::SPoly
                  (in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18,
                   in_stack_ffffffffffffff10);
        Reduce(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        bVar2 = MP<136UL,_GF2::MOGrevlex<136UL>_>::operator!=
                          (in_stack_ffffffffffffff00,
                           SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
        if (bVar2) {
          local_1 = false;
          goto LAB_001835dd;
        }
      }
    }
    std::reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>::
    reverse_iterator(&local_70,
                     (reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                      *)((long)&local_48.
                                super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
                                super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
                                _M_impl._M_node.super__List_node_base + 8));
    std::reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>::
    operator++((reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                *)in_stack_fffffffffffffef0);
    while( true ) {
      std::__cxx11::
      list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
      ::rend((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
              *)in_stack_fffffffffffffef8);
      bVar2 = std::operator!=((reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                               *)in_stack_fffffffffffffef0,
                              (reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
      if (!bVar2) break;
      std::reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>::
      operator->((reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                  *)in_stack_fffffffffffffef0);
      in_stack_ffffffffffffff20 =
           (MP<136UL,_GF2::MOGrevlex<136UL>_> *)
           MP<136UL,_GF2::MOGrevlex<136UL>_>::LM(in_stack_fffffffffffffef0);
      in_stack_ffffffffffffff18 =
           std::
           reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>::
           operator->((reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                       *)in_stack_fffffffffffffef0);
      in_stack_ffffffffffffff10 =
           (MP<136UL,_GF2::MOGrevlex<136UL>_> *)
           MP<136UL,_GF2::MOGrevlex<136UL>_>::LM(in_stack_fffffffffffffef0);
      in_stack_ffffffffffffff0f =
           MM<136UL>::IsRelPrime
                     ((MM<136UL> *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                      (MM<136UL> *)in_stack_ffffffffffffff00);
      if (!(bool)in_stack_ffffffffffffff0f) {
        in_stack_ffffffffffffff00 =
             std::
             reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>::
             operator*((reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                        *)in_stack_fffffffffffffef0);
        in_stack_fffffffffffffef8 =
             std::
             reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>::
             operator*((reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                        *)in_stack_fffffffffffffef0);
        in_stack_fffffffffffffef0 =
             MP<136UL,_GF2::MOGrevlex<136UL>_>::SPoly
                       (in_RDI,(MP<136UL,_GF2::MOGrevlex<136UL>_> *)
                               CONCAT17(uVar1,in_stack_ffffffffffffff78),poly2);
        Reduce(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        in_stack_fffffffffffffeef =
             MP<136UL,_GF2::MOGrevlex<136UL>_>::operator!=
                       (in_stack_ffffffffffffff00,SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0))
        ;
        if ((bool)in_stack_fffffffffffffeef) {
          local_1 = false;
          goto LAB_001835dd;
        }
      }
      std::reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>::
      operator++((reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                  *)in_stack_fffffffffffffef0);
    }
    local_48.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
    super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node._M_size =
         local_48.super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>.
         super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node._M_size
         + 1;
    Env::Trace("IsGB: %zu polys");
    std::reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>::
    operator++((reverse_iterator<std::_List_const_iterator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                *)in_stack_fffffffffffffef0);
  } while( true );
}

Assistant:

bool IsGB() const
	{
		MP<_n, _O> poly(_order);
		// цикл по многочленам
		size_t trace = 0;
        for (const_reverse_iterator iter = rbegin(); iter != rend(); ++iter)
		{
			// цикл по парам (многочлен, уравнение поля)
			for (size_t i = 0; i < _n; i++)
				if (iter->LM().Test(i))
				{
					Reduce(poly.SPoly(i, *iter));
					if (poly != 0)
						return false;
				}
			// цикл по парам (многочлен, многочлен1)
			const_reverse_iterator iter1 = iter;
			for (++iter1; iter1 != rend(); ++iter1)
				if (!iter->LM().IsRelPrime(iter1->LM()))
				{
					Reduce(poly.SPoly(*iter, *iter1));
					if (poly != 0) 
						return false;
				}
			// трассировка
			Env::Trace("IsGB: %zu polys", ++trace);
		}
		return true;
	}